

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>
::find_or_prepare_insert_non_soo<std::__cxx11::string>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  char *pcVar1;
  size_t size;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  bool bVar38;
  char cVar39;
  ushort uVar40;
  uint uVar41;
  MixingHashState MVar42;
  long lVar43;
  ctrl_t *pcVar44;
  ulong uVar45;
  anon_union_8_1_a8a14541_for_iterator_2 aVar46;
  bool bVar47;
  uint64_t v;
  ulong uVar48;
  ulong uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  FindInfo FVar53;
  __m128i match;
  ulong local_b0;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined1 local_68 [16];
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_google::protobuf::compiler::CommandLineInterface::GeneratorInfo_&>_>
  local_58;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  size = key->_M_string_length;
  MVar42 = hash_internal::MixingHashState::combine_contiguous
                     ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                      (uchar *)(key->_M_dataplus)._M_p,size);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = MVar42.state_ + size;
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar49 = SUB168(auVar50 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar50 * ZEXT816(0x9ddfea08eb382d69),0);
  uVar3 = *(ulong *)(this + 0x10);
  uVar45 = (uVar49 >> 7 ^ uVar3 >> 0xc) & uVar2;
  auVar50 = ZEXT216(CONCAT11((char)uVar49,(char)uVar49) & 0x7f7f);
  auVar50 = pshuflw(auVar50,auVar50,0);
  local_68._0_4_ = auVar50._0_4_;
  local_68._4_4_ = local_68._0_4_;
  local_68._8_4_ = local_68._0_4_;
  local_68._12_4_ = local_68._0_4_;
  pcVar44 = (__return_storage_ptr__->first).ctrl_;
  aVar46 = (__return_storage_ptr__->first).field_1;
  bVar47 = __return_storage_ptr__->second;
  local_b0 = 0;
  do {
    pcVar1 = (char *)(uVar3 + uVar45);
    auVar51[0] = -(local_68[0] == *pcVar1);
    auVar51[1] = -(local_68[1] == pcVar1[1]);
    auVar51[2] = -(local_68[2] == pcVar1[2]);
    auVar51[3] = -(local_68[3] == pcVar1[3]);
    auVar51[4] = -(local_68[4] == pcVar1[4]);
    auVar51[5] = -(local_68[5] == pcVar1[5]);
    auVar51[6] = -(local_68[6] == pcVar1[6]);
    auVar51[7] = -(local_68[7] == pcVar1[7]);
    auVar51[8] = -(local_68[8] == pcVar1[8]);
    auVar51[9] = -(local_68[9] == pcVar1[9]);
    auVar51[10] = -(local_68[10] == pcVar1[10]);
    auVar51[0xb] = -(local_68[0xb] == pcVar1[0xb]);
    auVar51[0xc] = -(local_68[0xc] == pcVar1[0xc]);
    auVar51[0xd] = -(local_68[0xd] == pcVar1[0xd]);
    auVar51[0xe] = -(local_68[0xe] == pcVar1[0xe]);
    auVar51[0xf] = -(local_68[0xf] == pcVar1[0xf]);
    uVar40 = (ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe | (ushort)(auVar51[0xf] >> 7) << 0xf;
    uVar41 = (uint)uVar40;
    cVar22 = *pcVar1;
    cVar23 = pcVar1[1];
    cVar24 = pcVar1[2];
    cVar25 = pcVar1[3];
    cVar26 = pcVar1[4];
    cVar27 = pcVar1[5];
    cVar28 = pcVar1[6];
    cVar29 = pcVar1[7];
    cVar30 = pcVar1[8];
    cVar31 = pcVar1[9];
    cVar32 = pcVar1[10];
    cVar33 = pcVar1[0xb];
    cVar34 = pcVar1[0xc];
    cVar35 = pcVar1[0xd];
    cVar36 = pcVar1[0xe];
    cVar37 = pcVar1[0xf];
    cVar39 = local_48;
    cVar7 = cStack_47;
    cVar8 = cStack_46;
    cVar9 = cStack_45;
    cVar10 = cStack_44;
    cVar11 = cStack_43;
    cVar12 = cStack_42;
    cVar13 = cStack_41;
    cVar14 = cStack_40;
    cVar15 = cStack_3f;
    cVar16 = cStack_3e;
    cVar17 = cStack_3d;
    cVar18 = cStack_3c;
    cVar19 = cStack_3b;
    cVar20 = cStack_3a;
    cVar21 = cStack_39;
    while (cStack_39 = cVar37, cStack_3a = cVar36, cStack_3b = cVar35, cStack_3c = cVar34,
          cStack_3d = cVar33, cStack_3e = cVar32, cStack_3f = cVar31, cStack_40 = cVar30,
          cStack_41 = cVar29, cStack_42 = cVar28, cStack_43 = cVar27, cStack_44 = cVar26,
          cStack_45 = cVar25, cStack_46 = cVar24, cStack_47 = cVar23, local_48 = cVar22, uVar40 != 0
          ) {
      uVar5 = 0;
      if (uVar41 != 0) {
        for (; (uVar41 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar48 = uVar5 + uVar45 & uVar2;
      lVar43 = uVar48 * 0x88;
      local_58.second.
      super__Tuple_impl<0UL,_const_google::protobuf::compiler::CommandLineInterface::GeneratorInfo_&>
      .
      super__Head_base<0UL,_const_google::protobuf::compiler::CommandLineInterface::GeneratorInfo_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_google::protobuf::compiler::CommandLineInterface::GeneratorInfo_&>
            )(*(long *)(this + 0x18) + lVar43 + 0x20);
      local_58.first.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            )(*(long *)(this + 0x18) + lVar43);
      local_78.rhs = key;
      local_78.eq = (key_equal *)this;
      bVar38 = memory_internal::
               DecomposePairImpl<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<google::protobuf::compiler::CommandLineInterface::GeneratorInfo_const&>>
                         (&local_78,&local_58);
      if (bVar38) {
        (__return_storage_ptr__->first).field_1 = aVar46;
        __return_storage_ptr__->second = bVar47;
        (__return_storage_ptr__->first).ctrl_ = pcVar44;
        if (*(long *)(this + 0x10) != 0) {
          lVar4 = *(long *)(this + 0x18);
          (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar48);
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar43 + lVar4);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_0017a3fe;
      }
      uVar40 = (ushort)(uVar41 - 1) & (ushort)uVar41;
      uVar41 = CONCAT22((short)(uVar41 - 1 >> 0x10),uVar40);
      cVar22 = local_48;
      cVar23 = cStack_47;
      cVar24 = cStack_46;
      cVar25 = cStack_45;
      cVar26 = cStack_44;
      cVar27 = cStack_43;
      cVar28 = cStack_42;
      cVar29 = cStack_41;
      cVar30 = cStack_40;
      cVar31 = cStack_3f;
      cVar32 = cStack_3e;
      cVar33 = cStack_3d;
      cVar34 = cStack_3c;
      cVar35 = cStack_3b;
      cVar36 = cStack_3a;
      cVar37 = cStack_39;
      cVar39 = local_48;
      cVar7 = cStack_47;
      cVar8 = cStack_46;
      cVar9 = cStack_45;
      cVar10 = cStack_44;
      cVar11 = cStack_43;
      cVar12 = cStack_42;
      cVar13 = cStack_41;
      cVar14 = cStack_40;
      cVar15 = cStack_3f;
      cVar16 = cStack_3e;
      cVar17 = cStack_3d;
      cVar18 = cStack_3c;
      cVar19 = cStack_3b;
      cVar20 = cStack_3a;
      cVar21 = cStack_39;
    }
    auVar52[0] = -(local_48 == -0x80);
    auVar52[1] = -(cStack_47 == -0x80);
    auVar52[2] = -(cStack_46 == -0x80);
    auVar52[3] = -(cStack_45 == -0x80);
    auVar52[4] = -(cStack_44 == -0x80);
    auVar52[5] = -(cStack_43 == -0x80);
    auVar52[6] = -(cStack_42 == -0x80);
    auVar52[7] = -(cStack_41 == -0x80);
    auVar52[8] = -(cStack_40 == -0x80);
    auVar52[9] = -(cStack_3f == -0x80);
    auVar52[10] = -(cStack_3e == -0x80);
    auVar52[0xb] = -(cStack_3d == -0x80);
    auVar52[0xc] = -(cStack_3c == -0x80);
    auVar52[0xd] = -(cStack_3b == -0x80);
    auVar52[0xe] = -(cStack_3a == -0x80);
    auVar52[0xf] = -(cStack_39 == -0x80);
    uVar40 = (ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe | (ushort)(auVar52[0xf] >> 7) << 0xf;
    local_48 = cVar39;
    cStack_47 = cVar7;
    cStack_46 = cVar8;
    cStack_45 = cVar9;
    cStack_44 = cVar10;
    cStack_43 = cVar11;
    cStack_42 = cVar12;
    cStack_41 = cVar13;
    cStack_40 = cVar14;
    cStack_3f = cVar15;
    cStack_3e = cVar16;
    cStack_3d = cVar17;
    cStack_3c = cVar18;
    cStack_3b = cVar19;
    cStack_3a = cVar20;
    cStack_39 = cVar21;
    if (uVar40 == 0) {
      if (*(ulong *)this < local_b0 + 0x10) {
        (__return_storage_ptr__->first).field_1 = aVar46;
        __return_storage_ptr__->second = bVar47;
        (__return_storage_ptr__->first).ctrl_ = pcVar44;
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xef5,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>, K = std::basic_string<char>]"
                     );
      }
      uVar45 = uVar45 + local_b0 + 0x10 & uVar2;
      local_b0 = local_b0 + 0x10;
    }
    else {
      cVar39 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                         (*(ulong *)this,uVar49,*(ctrl_t **)(this + 0x10));
      if (cVar39 == '\0') {
        uVar41 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
          }
        }
      }
      else {
        uVar6 = 0xf;
        if (uVar40 != 0) {
          for (; uVar40 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar41 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      FVar53.offset = uVar41 + uVar45 & uVar2;
      FVar53.probe_length = local_b0;
      lVar43 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                         ((CommonFields *)this,uVar49,FVar53,
                          (PolicyFunctions *)GetPolicyFunctions()::value);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar46;
        __return_storage_ptr__->second = bVar47;
        (__return_storage_ptr__->first).ctrl_ = pcVar44;
LAB_0017a3fe:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>]"
                     );
      }
      pcVar44 = (ctrl_t *)(*(long *)(this + 0x10) + lVar43);
      aVar46.slot_ = (slot_type *)(lVar43 * 0x88 + *(long *)(this + 0x18));
      bVar47 = true;
    }
    if (uVar40 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar46;
      __return_storage_ptr__->second = bVar47;
      (__return_storage_ptr__->first).ctrl_ = pcVar44;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }